

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_connected_constraints
          (Proof *this,int p,int t,function<bool_(int,_int)> *adj)

{
  long *plVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  ulong uVar6;
  pointer pbVar7;
  bool bVar8;
  pointer pcVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  long lVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  uint __val;
  pointer pcVar16;
  uint __val_00;
  uint __val_01;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var17;
  int iVar18;
  pointer pcVar19;
  int __val_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  pointer pcVar20;
  pointer pbVar21;
  string m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong local_1a8;
  string n;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ors;
  string local_138;
  ulong local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator<<((ostream *)
                  &((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   field_0x50,"* selected vertices must be connected, walk 1\n");
  local_1a8 = (ulong)t;
  pcVar9 = (pointer)(ulong)(uint)(~(p >> 0x1f) & p);
  for (pcVar20 = (pointer)0x0; pcVar20 != pcVar9; pcVar20 = pcVar20 + 1) {
    for (pcVar19 = (pointer)0x0; pcVar20 != pcVar19; pcVar19 = pcVar19 + 1) {
      __val_02 = (int)pcVar20;
      std::__cxx11::to_string(&local_178,__val_02);
      std::operator+(&local_1c8,"conn1_",&local_178);
      std::operator+(&m,&local_1c8,"_");
      iVar18 = (int)pcVar19;
      std::__cxx11::to_string(&local_138,iVar18);
      std::operator+(&n,&m,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&m);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_178);
      m._M_dataplus._M_p = (pointer)CONCAT44(__val_02,iVar18);
      m._M_string_length = CONCAT44(m._M_string_length._4_4_,1);
      std::
      _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                  *)&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     connected_variable_mappings,(tuple<int,_int,_int> *)&m,&n);
      bVar8 = std::function<bool_(int,_int)>::operator()(adj,__val_02,iVar18);
      poVar10 = (ostream *)
                &((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                 field_0x50;
      if (bVar8) {
        poVar10 = std::operator<<(poVar10,"1 ~x");
        poVar10 = std::operator<<(poVar10,(string *)&n);
        poVar10 = std::operator<<(poVar10," 1 ~x");
        m._M_string_length = local_1a8;
        m._M_dataplus._M_p = pcVar20;
        pmVar11 = std::
                  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->variable_mappings,(key_type *)&m);
        poVar10 = std::operator<<(poVar10,(string *)pmVar11);
        std::operator<<(poVar10," >= 1 ;\n");
        poVar10 = std::operator<<((ostream *)
                                  &((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                   _M_head_impl)->field_0x50,"1 ~x");
        poVar10 = std::operator<<(poVar10,(string *)&n);
        poVar10 = std::operator<<(poVar10," 1 ~x");
        m._M_string_length = local_1a8;
        m._M_dataplus._M_p = pcVar19;
        pmVar11 = std::
                  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->variable_mappings,(key_type *)&m);
        poVar10 = std::operator<<(poVar10,(string *)pmVar11);
        std::operator<<(poVar10," >= 1 ;\n");
        poVar10 = std::operator<<((ostream *)
                                  &((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                   _M_head_impl)->field_0x50,"1 x");
        poVar10 = std::operator<<(poVar10,(string *)&n);
        poVar10 = std::operator<<(poVar10," 1 x");
        m._M_string_length = local_1a8;
        m._M_dataplus._M_p = pcVar20;
        pmVar11 = std::
                  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->variable_mappings,(key_type *)&m);
        poVar10 = std::operator<<(poVar10,(string *)pmVar11);
        poVar10 = std::operator<<(poVar10," 1 x");
        local_1c8._M_string_length = local_1a8;
        local_1c8._M_dataplus._M_p = pcVar19;
        pmVar11 = std::
                  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->variable_mappings,(key_type *)&local_1c8);
        poVar10 = std::operator<<(poVar10,(string *)pmVar11);
        std::operator<<(poVar10," >= 1 ;\n");
        lVar12 = 3;
      }
      else {
        poVar10 = std::operator<<(poVar10,"1 ~x");
        poVar10 = std::operator<<(poVar10,(string *)&n);
        std::operator<<(poVar10," >= 1 ;\n");
        lVar12 = 1;
      }
      plVar1 = &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                nb_constraints;
      *plVar1 = *plVar1 + lVar12;
      std::__cxx11::string::~string((string *)&n);
    }
  }
  if (p <= t) {
    t = p;
  }
  local_118 = (ulong)(uint)p;
  iVar18 = 2;
  while( true ) {
    poVar10 = std::operator<<((ostream *)
                              &((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->field_0x50,
                              "* selected vertices must be connected, walk ");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar18);
    std::operator<<(poVar10,'\n');
    sVar13 = (size_type)(iVar18 >> 1);
    for (pcVar20 = (pointer)0x0; pcVar20 != pcVar9; pcVar20 = pcVar20 + 1) {
      for (pcVar19 = (pointer)0x0; pcVar19 != pcVar20; pcVar19 = pcVar19 + 1) {
        std::__cxx11::to_string(&local_f0,iVar18);
        std::operator+(&local_138,"conn",&local_f0);
        std::operator+(&local_178,&local_138,"_");
        __val_00 = (uint)pcVar20;
        std::__cxx11::to_string(&local_110,__val_00);
        std::operator+(&local_1c8,&local_178,&local_110);
        std::operator+(&m,&local_1c8,"_");
        __val_01 = (uint)pcVar19;
        std::__cxx11::to_string(&local_d0,__val_01);
        std::operator+(&n,&m,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_f0);
        m._M_dataplus._M_p = (pointer)CONCAT44(__val_00,__val_01);
        m._M_string_length = CONCAT44(m._M_string_length._4_4_,iVar18);
        std::
        _Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::tuple<int,int,int>,std::__cxx11::string&>
                  ((_Rb_tree<std::tuple<long,long,long>,std::pair<std::tuple<long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                    *)&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       connected_variable_mappings,(tuple<int,_int,_int> *)&m,&n);
        ors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar16 = (pointer)0x0;
        ors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        while( true ) {
          __val = (uint)pcVar16;
          if ((uint)local_118 == __val) break;
          if (pcVar19 != pcVar16 && pcVar20 != pcVar16) {
            std::__cxx11::to_string(&local_b0,iVar18);
            std::operator+(&local_d0,"conn",&local_b0);
            std::operator+(&local_110,&local_d0,"_");
            std::__cxx11::to_string(&local_70,__val_00);
            std::operator+(&local_f0,&local_110,&local_70);
            std::operator+(&local_138,&local_f0,"_");
            std::__cxx11::to_string(&local_90,__val_01);
            std::operator+(&local_178,&local_138,&local_90);
            std::operator+(&local_1c8,&local_178,"_via_");
            std::__cxx11::to_string(&local_50,__val);
            std::operator+(&m,&local_1c8,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&ors,&m);
            local_1c8._M_dataplus._M_p = (pointer)CONCAT44(__val_01,__val);
            local_1c8._M_string_length = CONCAT44(iVar18,__val_00);
            std::
            _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::tuple<int,int,int,int>,std::__cxx11::string&>
                      ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                        *)&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->connected_variable_mappings_aux,(tuple<int,_int,_int,_int> *)&local_1c8
                       ,&m);
            poVar10 = std::operator<<((ostream *)
                                      &((this->_imp)._M_t.
                                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                       _M_head_impl)->field_0x50,"1 x");
            pcVar4 = pcVar16;
            if (__val_00 < __val) {
              pcVar4 = pcVar20;
            }
            pcVar2 = pcVar20;
            if (__val_00 < __val) {
              pcVar2 = pcVar16;
            }
            local_1c8._M_dataplus._M_p = (pointer)((ulong)pcVar4 & 0xffffffff);
            local_1c8._M_string_length = (ulong)pcVar2 & 0xffffffff;
            local_1c8.field_2._M_allocated_capacity = sVar13;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,
                                   (key_type *)&local_1c8);
            poVar10 = std::operator<<(poVar10,(string *)pmVar14);
            poVar10 = std::operator<<(poVar10," 1 ~x");
            poVar10 = std::operator<<(poVar10,(string *)&m);
            std::operator<<(poVar10," >= 1 ;\n");
            poVar10 = std::operator<<((ostream *)
                                      &((this->_imp)._M_t.
                                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                       _M_head_impl)->field_0x50,"1 x");
            pcVar5 = pcVar16;
            if (__val_01 < __val) {
              pcVar5 = pcVar19;
            }
            pcVar3 = pcVar19;
            if (__val_01 < __val) {
              pcVar3 = pcVar16;
            }
            local_1c8._M_dataplus._M_p = (pointer)((ulong)pcVar5 & 0xffffffff);
            local_1c8._M_string_length = (ulong)pcVar3 & 0xffffffff;
            local_1c8.field_2._M_allocated_capacity = sVar13;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,
                                   (key_type *)&local_1c8);
            poVar10 = std::operator<<(poVar10,(string *)pmVar14);
            poVar10 = std::operator<<(poVar10," 1 ~x");
            poVar10 = std::operator<<(poVar10,(string *)&m);
            std::operator<<(poVar10," >= 1 ;\n");
            poVar10 = std::operator<<((ostream *)
                                      &((this->_imp)._M_t.
                                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                       _M_head_impl)->field_0x50,"1 x");
            poVar10 = std::operator<<(poVar10,(string *)&m);
            poVar10 = std::operator<<(poVar10," 1 ~x");
            local_1c8._M_dataplus._M_p = (pointer)((ulong)pcVar4 & 0xffffffff);
            local_1c8._M_string_length = (ulong)pcVar2 & 0xffffffff;
            local_1c8.field_2._M_allocated_capacity = sVar13;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,
                                   (key_type *)&local_1c8);
            poVar10 = std::operator<<(poVar10,(string *)pmVar14);
            poVar10 = std::operator<<(poVar10," 1 ~x");
            local_178._M_dataplus._M_p = (pointer)((ulong)pcVar5 & 0xffffffff);
            local_178._M_string_length = (ulong)pcVar3 & 0xffffffff;
            local_178.field_2._M_allocated_capacity = sVar13;
            pmVar14 = std::
                      map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                    _M_head_impl)->connected_variable_mappings,
                                   (key_type *)&local_178);
            poVar10 = std::operator<<(poVar10,(string *)pmVar14);
            std::operator<<(poVar10," >= 1 ;\n");
            plVar1 = &((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      nb_constraints;
            *plVar1 = *plVar1 + 3;
            std::__cxx11::string::~string((string *)&m);
          }
          pcVar16 = pcVar16 + 1;
        }
        poVar10 = std::operator<<((ostream *)
                                  &((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                   _M_head_impl)->field_0x50,"1 ~x");
        std::operator<<(poVar10,(string *)&n);
        pbVar7 = ors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar21 = ors.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            poVar10 = (ostream *)
                      &((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       field_0x50, pbVar21 != pbVar7; pbVar21 = pbVar21 + 1) {
          poVar10 = std::operator<<(poVar10," 1 x");
          std::operator<<(poVar10,(string *)pbVar21);
        }
        poVar10 = std::operator<<(poVar10," 1 x");
        m._M_dataplus._M_p = pcVar19;
        m._M_string_length = (size_type)pcVar20;
        m.field_2._M_allocated_capacity = sVar13;
        pmVar14 = std::
                  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->connected_variable_mappings,(key_type *)&m);
        std::operator<<(poVar10,(string *)pmVar14);
        std::operator<<((ostream *)
                        &((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         field_0x50," >= 1 ;\n");
        pbVar7 = ors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var17._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
        (_Var17._M_head_impl)->nb_constraints = (_Var17._M_head_impl)->nb_constraints + 1;
        for (pbVar21 = ors.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar7;
            pbVar21 = pbVar21 + 1) {
          poVar10 = std::operator<<((ostream *)&(_Var17._M_head_impl)->field_0x50,"1 x");
          poVar10 = std::operator<<(poVar10,(string *)&n);
          poVar10 = std::operator<<(poVar10," 1 ~x");
          poVar10 = std::operator<<(poVar10,(string *)pbVar21);
          std::operator<<(poVar10," >= 1 ;\n");
          _Var17._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          (_Var17._M_head_impl)->nb_constraints = (_Var17._M_head_impl)->nb_constraints + 1;
        }
        poVar10 = std::operator<<((ostream *)&(_Var17._M_head_impl)->field_0x50,"1 x");
        poVar10 = std::operator<<(poVar10,(string *)&n);
        poVar10 = std::operator<<(poVar10," 1 ~x");
        m._M_dataplus._M_p = pcVar19;
        m._M_string_length = (size_type)pcVar20;
        m.field_2._M_allocated_capacity = sVar13;
        pmVar14 = std::
                  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->connected_variable_mappings,(key_type *)&m);
        poVar10 = std::operator<<(poVar10,(string *)pmVar14);
        std::operator<<(poVar10," >= 1 ;\n");
        plVar1 = &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  nb_constraints;
        *plVar1 = *plVar1 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ors);
        std::__cxx11::string::~string((string *)&n);
      }
    }
    if (t <= iVar18) break;
    iVar18 = iVar18 * 2;
  }
  std::operator<<((ostream *)
                  &((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   field_0x50,"* if two vertices are used, they must be connected\n");
  for (pcVar20 = (pointer)0x0; pcVar20 != pcVar9; pcVar20 = pcVar20 + 1) {
    for (pcVar19 = (pointer)0x0; pcVar20 != pcVar19; pcVar19 = pcVar19 + 1) {
      poVar10 = std::operator<<((ostream *)
                                &((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->field_0x50,"1 x");
      uVar6 = local_1a8;
      n._M_string_length = local_1a8;
      n._M_dataplus._M_p = pcVar20;
      pmVar11 = std::
                map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->variable_mappings,(key_type *)&n);
      poVar10 = std::operator<<(poVar10,(string *)pmVar11);
      poVar10 = std::operator<<(poVar10," 1 x");
      m._M_string_length = uVar6;
      m._M_dataplus._M_p = pcVar19;
      pmVar11 = std::
                map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->variable_mappings,(key_type *)&m);
      std::operator<<(poVar10,(string *)pmVar11);
      n._M_dataplus._M_p = pcVar19;
      n._M_string_length = (size_type)pcVar20;
      n.field_2._M_allocated_capacity = (long)iVar18;
      iVar15 = std::
               _Rb_tree<std::tuple<long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&(((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       connected_variable_mappings)._M_t,(key_type *)&n);
      _Var17._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      if ((_Rb_tree_header *)iVar15._M_node !=
          (_Rb_tree_header *)((long)&(_Var17._M_head_impl)->connected_variable_mappings + 8U)) {
        poVar10 = std::operator<<((ostream *)&(_Var17._M_head_impl)->field_0x50," 1 x");
        n._M_dataplus._M_p = pcVar19;
        n._M_string_length = (size_type)pcVar20;
        n.field_2._M_allocated_capacity = (long)iVar18;
        pmVar14 = std::
                  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->connected_variable_mappings,(key_type *)&n);
        std::operator<<(poVar10,(string *)pmVar14);
        _Var17._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      }
      std::operator<<((ostream *)&(_Var17._M_head_impl)->field_0x50," >= 1 ;\n");
      plVar1 = &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                nb_constraints;
      *plVar1 = *plVar1 + 1;
    }
  }
  return;
}

Assistant:

auto Proof::create_connected_constraints(int p, int t, const function<auto(int, int)->bool> & adj) -> void
{
    _imp->model_stream << "* selected vertices must be connected, walk 1\n";
    int mapped_to_null = t;
    int cnum = _imp->variable_mappings.size();

    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            string n = "conn1_" + to_string(v) + "_" + to_string(w);
            _imp->connected_variable_mappings.emplace(tuple{1, v, w}, n);
            if (! adj(v, w)) {
                // v not adjacent to w, so the walk does not exist
                _imp->model_stream << "1 ~x" << n << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }
            else {
                // v = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{v, mapped_to_null}] << " >= 1 ;\n";
                // w = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                // either v = null, or w = null, or the walk exists
                _imp->model_stream << "1 x" << n << " 1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                                   << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                _imp->nb_constraints += 3;
            }
        }

    int last_k = 0;
    for (int k = 2 ; ; k *= 2) {
        last_k = k;
        _imp->model_stream << "* selected vertices must be connected, walk " << k << '\n';
        for (int v = 0; v < p; ++v)
            for (int w = 0; w < v; ++w) {
                string n = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w);
                _imp->connected_variable_mappings.emplace(tuple{k, v, w}, n);

                vector<string> ors;
                for (int u = 0; u < p; ++u) {
                    if (v != w && v != u && u != w) {
                        string m = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w) + "_via_" + to_string(u);
                        ors.push_back(m);
                        _imp->connected_variable_mappings_aux.emplace(tuple{k, v, w, u}, m);
                        // either the first half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, v), min(u, v)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // either the second half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // one of the half walks is false, or the via term must be true
                        _imp->model_stream << "1 x" << m
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(v, u), min(v, u)}]
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}] << " >= 1 ;\n";
                        _imp->nb_constraints += 3;
                    }
                }

                // one of the vias must be true, or a shorter walk exists, or the entry is false
                _imp->model_stream << "1 ~x" << n;
                for (auto & o : ors)
                    _imp->model_stream << " 1 x" << o;
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}];
                _imp->model_stream << " >= 1 ;\n";
                ++_imp->nb_constraints;

                // if the entry is false, then all of the vias must be false and the shorter walk must be false
                for (auto & o : ors) {
                    _imp->model_stream << "1 x" << n << " 1 ~x" << o << " >= 1 ;\n";
                    ++_imp->nb_constraints;
                }
                _imp->model_stream << "1 x" << n << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}] << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }

        if (k >= min(p, t))
            break;
    }

    _imp->model_stream << "* if two vertices are used, they must be connected\n";
    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            _imp->model_stream << "1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                               << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}];
            auto var = _imp->connected_variable_mappings.find(tuple{last_k, v, w});
            if (var != _imp->connected_variable_mappings.end())
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{last_k, v, w}];
            _imp->model_stream << " >= 1 ;\n";
            ++_imp->nb_constraints;
        }
}